

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void Mem_StepStop(Mem_Step_t *p,int fVerbose)

{
  long lVar1;
  
  if (0 < p->nMems) {
    lVar1 = 0;
    do {
      Mem_FixedStop(p->pMems[lVar1],fVerbose);
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nMems);
  }
  if (p->pLargeChunks != (void **)0x0) {
    if (0 < p->nLargeChunks) {
      lVar1 = 0;
      do {
        if (p->pLargeChunks[lVar1] != (void *)0x0) {
          free(p->pLargeChunks[lVar1]);
          p->pLargeChunks[lVar1] = (void *)0x0;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < p->nLargeChunks);
    }
    if (p->pLargeChunks != (void **)0x0) {
      free(p->pLargeChunks);
      p->pLargeChunks = (void **)0x0;
    }
  }
  if (p->pMems != (Mem_Fixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Mem_Fixed_t **)0x0;
  }
  if (p->pMap != (Mem_Fixed_t **)0x0) {
    free(p->pMap);
    p->pMap = (Mem_Fixed_t **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Mem_StepStop( Mem_Step_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Mem_FixedStop( p->pMems[i], fVerbose );
    if ( p->pLargeChunks ) 
    {
        for ( i = 0; i < p->nLargeChunks; i++ )
            ABC_FREE( p->pLargeChunks[i] );
        ABC_FREE( p->pLargeChunks );
    }
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}